

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

void __thiscall
pybind11::detail::loader_life_support::loader_life_support(loader_life_support *this)

{
  loader_life_support *plVar1;
  loader_life_support *this_local;
  
  this->parent = (loader_life_support *)0x0;
  std::
  unordered_set<_object_*,_std::hash<_object_*>,_std::equal_to<_object_*>,_std::allocator<_object_*>_>
  ::unordered_set(&this->keep_alive);
  plVar1 = get_stack_top();
  this->parent = plVar1;
  set_stack_top(this);
  return;
}

Assistant:

loader_life_support() {
        parent = get_stack_top();
        set_stack_top(this);
    }